

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,StructDef *def,bool object_api,
          bool force_ns_wrap)

{
  bool force_ns_wrap_local;
  bool object_api_local;
  StructDef *def_local;
  TsGenerator *this_local;
  
  if ((object_api) &&
     (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0)) {
    if (force_ns_wrap) {
      IdlNamer::NamespacedObjectType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&def->super_Definition);
    }
    else {
      IdlNamer::ObjectType_abi_cxx11_(__return_storage_ptr__,&this->namer_,def);
    }
  }
  else if (force_ns_wrap) {
    IdlNamer::NamespacedType_abi_cxx11_(__return_storage_ptr__,&this->namer_,&def->super_Definition)
    ;
  }
  else {
    IdlNamer::Type_abi_cxx11_(__return_storage_ptr__,&this->namer_,def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeName(const StructDef &def, const bool object_api = false,
                          const bool force_ns_wrap = false) {
    if (object_api && parser_.opts.generate_object_based_api) {
      if (force_ns_wrap) {
        return namer_.NamespacedObjectType(def);
      } else {
        return namer_.ObjectType(def);
      }
    } else {
      if (force_ns_wrap) {
        return namer_.NamespacedType(def);
      } else {
        return namer_.Type(def);
      }
    }
  }